

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  lu_byte lVar1;
  byte bVar2;
  Node *pNVar3;
  byte bVar4;
  uint uVar5;
  TValue *pTVar6;
  lu_byte *plVar7;
  ulong uVar8;
  long lVar9;
  Node *value;
  bool bVar10;
  Table local_90;
  Value local_58;
  lu_byte local_50;
  Node *local_48;
  Node *pNStack_40;
  
  uVar5 = setlimittosize(t);
  setnodevector(L,&local_90,nhsize);
  if (newasize < uVar5) {
    t->alimit = newasize;
    lVar1 = t->lsizenode;
    local_48 = t->node;
    pNStack_40 = t->lastfree;
    t->lsizenode = local_90.lsizenode;
    t->node = local_90.node;
    t->lastfree = local_90.lastfree;
    uVar8 = (ulong)newasize;
    lVar9 = uVar8 << 4;
    while (uVar8 < uVar5) {
      uVar8 = uVar8 + 1;
      if (((&t->array->tt_)[lVar9] & 0xf) != 0) {
        luaH_setint(L,t,uVar8,(TValue *)((long)&t->array->value_ + lVar9));
      }
      lVar9 = lVar9 + 0x10;
    }
    t->alimit = uVar5;
    local_90.lsizenode = t->lsizenode;
    t->lsizenode = lVar1;
    local_90.node = t->node;
    local_90.lastfree = t->lastfree;
    t->node = local_48;
    t->lastfree = pNStack_40;
  }
  uVar8 = (ulong)uVar5;
  pTVar6 = (TValue *)luaM_realloc_(L,t->array,uVar8 * 0x10,(ulong)newasize << 4);
  if ((newasize != 0) && (pTVar6 == (TValue *)0x0)) {
    freehash(L,&local_90);
    luaD_throw(L,4);
  }
  bVar2 = t->lsizenode;
  value = t->node;
  pNVar3 = t->lastfree;
  t->lsizenode = local_90.lsizenode;
  t->node = local_90.node;
  t->lastfree = local_90.lastfree;
  t->array = pTVar6;
  t->alimit = newasize;
  plVar7 = &pTVar6[uVar8].tt_;
  for (; uVar8 < newasize; uVar8 = uVar8 + 1) {
    *plVar7 = '\x10';
    plVar7 = plVar7 + 0x10;
  }
  bVar4 = bVar2 & 0x1f;
  uVar5 = 0;
  if (0 < 1 << bVar4) {
    uVar5 = 1 << bVar4;
  }
  uVar8 = (ulong)uVar5;
  local_90.lsizenode = bVar2;
  local_90.node = value;
  local_90.lastfree = pNVar3;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    if (((value->u).tt_ & 0xf) != 0) {
      local_58 = (value->u).key_val;
      local_50 = (value->u).key_tt;
      luaH_set(L,t,(TValue *)&local_58,&value->i_val);
    }
    value = value + 1;
  }
  freehash(L,&local_90);
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int newasize,
                                          unsigned int nhsize) {
  unsigned int i;
  Table newt;  /* to keep the new hash part */
  unsigned int oldasize = setlimittosize(t);
  TValue *newarray;
  /* create new hash part with appropriate size into 'newt' */
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    t->alimit = newasize;  /* pretend array has new size... */
    exchangehashpart(t, &newt);  /* and new hash */
    /* re-insert into the new hash the elements from vanishing slice */
    for (i = newasize; i < oldasize; i++) {
      if (!isempty(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    t->alimit = oldasize;  /* restore current size... */
    exchangehashpart(t, &newt);  /* and hash (in case of errors) */
  }
  /* allocate new array */
  newarray = luaM_reallocvector(L, t->array, oldasize, newasize, TValue);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->alimit = newasize;
  for (i = oldasize; i < newasize; i++)  /* clear new slice of the array */
     setempty(&t->array[i]);
  /* re-insert elements from old hash part into new parts */
  reinsert(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}